

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testNoAtt
          (TestStatus *__return_storage_ptr__,Context *context,bool multisample)

{
  VkAllocationCallbacks **this;
  Vector<int,_3> *pVVar1;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)17>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  RefData<vk::Handle<(vk::HandleType)8>_> data_08;
  RefData<vk::Handle<(vk::HandleType)23>_> data_09;
  bool bVar4;
  deUint32 dVar5;
  uint uVar6;
  int iVar7;
  deUint32 dVar8;
  VkResult result;
  VkPhysicalDeviceFeatures *__src;
  NotSupportedError *this_00;
  MovePtr *deviceInterface;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  ProgramCollection<vk::ProgramBinary> *pPVar9;
  ProgramBinary *pPVar10;
  Handle<(vk::HandleType)9> *pHVar11;
  Handle<(vk::HandleType)8> *pHVar12;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  Handle<(vk::HandleType)21> *pHVar13;
  Handle<(vk::HandleType)19> *pHVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  Handle<(vk::HandleType)22> *pHVar16;
  DescriptorSetUpdateBuilder *this_03;
  Handle<(vk::HandleType)24> *pHVar17;
  Allocation *pAVar18;
  void *pvVar19;
  const_reference src;
  VkDeviceSize VVar20;
  Handle<(vk::HandleType)16> *pHVar21;
  Handle<(vk::HandleType)17> *pHVar22;
  Handle<(vk::HandleType)14> *pHVar23;
  VkCommandBuffer_s **ppVVar24;
  VkExtent2D VVar25;
  Handle<(vk::HandleType)23> *pHVar26;
  reference this_04;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_05;
  Handle<(vk::HandleType)18> *pHVar27;
  VkDeviceMemory memory;
  TestContext *this_06;
  TestLog *log;
  uint uVar28;
  MovePtr *pMVar29;
  VkOffset3D VVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  allocator<char> local_b09;
  string local_b08;
  uint local_ae8;
  allocator<char> local_ae1;
  string local_ae0;
  Vector<unsigned_int,_4> local_ac0;
  undefined1 local_ab0 [8];
  ConstPixelBufferAccess resultImage;
  PixelBufferAccess expectedImage;
  TextureLevel textureLevel;
  TextureFormat format;
  undefined4 local_a28 [2];
  VkBufferMemoryBarrier bufferBarriers [1];
  Vector<int,_3> local_9cc;
  VkOffset3D local_9c0;
  undefined8 local_9b0;
  VkBufferImageCopy region;
  VkImageMemoryBarrier imageBarriers [1];
  undefined8 local_920;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  undefined1 local_8a8 [8];
  VkImageMemoryBarrier setImageLayoutBarrier;
  Move<vk::Handle<(vk::HandleType)23>_> local_858;
  RefData<vk::Handle<(vk::HandleType)23>_> local_838;
  Vector<int,_3> local_814;
  VkShaderModule local_808;
  VkShaderModule local_800;
  VkRenderPass local_7f8;
  VkPipelineLayout local_7f0;
  Move<vk::Handle<(vk::HandleType)18>_> local_7e8;
  value_type local_7c8;
  VkDeviceMemory local_7b8;
  deUint32 local_7ac;
  deUint64 local_7a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_7a0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_790;
  Move<vk::Handle<(vk::HandleType)8>_> local_780;
  RefData<vk::Handle<(vk::HandleType)8>_> local_760;
  VkDeviceSize local_740;
  VkDeviceSize vertexBufferSize;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  Move<vk::VkCommandBuffer_s_*> local_718;
  RefData<vk::VkCommandBuffer_s_*> local_6f8;
  undefined1 local_6d8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_698;
  undefined1 local_678 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_618;
  undefined1 local_5f8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_5b8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_598;
  undefined1 local_578 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  DescriptorSetUpdateBuilder local_548;
  deUint64 local_500;
  VkSampler local_4f8;
  undefined1 local_4f0 [8];
  VkDescriptorImageInfo descriptorImageInfo;
  undefined1 local_4c8 [8];
  Move<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  undefined1 local_490 [8];
  Move<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  undefined1 local_428 [8];
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_3f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_3e8;
  undefined1 local_3d8 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_3a8;
  undefined1 local_388 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  VkDeviceSize colorBufferSize;
  undefined1 local_330 [8];
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  undefined1 local_300 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> imageAlloc;
  undefined4 uStack_2e8;
  VkImageSubresourceRange imageSubresourceRange;
  Move<vk::Handle<(vk::HandleType)9>_> image;
  VkImageUsageFlags imageUsage;
  IVec3 imageDim;
  undefined1 local_2a0 [2];
  deUint8 imageLayers;
  deUint8 imageDepth;
  deUint8 imageHeight;
  deUint8 imageWidth;
  deUint8 numSamples;
  Move<vk::Handle<(vk::HandleType)14>_> local_280;
  RefData<vk::Handle<(vk::HandleType)14>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_218;
  Move<vk::Handle<(vk::HandleType)14>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1d8;
  undefined1 local_1b8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  IVec3 renderSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  VkPhysicalDeviceFeatures features;
  bool multisample_local;
  Context *context_local;
  
  features.variableMultisampleRate._3_1_ = multisample;
  unique0x100033f8 = context;
  __src = Context::getDeviceFeatures(context);
  memcpy(local_f8,__src,0xdc);
  if (features.pipelineStatisticsQuery != 0) {
    deviceInterface = (MovePtr *)Context::getDeviceInterface(stack0xffffffffffffffe8);
    device_00 = Context::getDevice(stack0xffffffffffffffe8);
    queue_00 = Context::getUniversalQueue(stack0xffffffffffffffe8);
    dVar5 = Context::getUniversalQueueFamilyIndex(stack0xffffffffffffffe8);
    allocator_00 = Context::getDefaultAllocator(stack0xffffffffffffffe8);
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)
               ((long)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                       m_allocator + 4),0x20,0x20,1);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    pPVar9 = Context::getBinaryCollection(stack0xffffffffffffffe8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"vert",
               (allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar9,&local_218);
    ::vk::createShaderModule(&local_1f8,(DeviceInterface *)deviceInterface,device_00,pPVar10,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_1d8.deleter.m_deviceIface;
    data_01.object.m_internal = local_1d8.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1d8.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_device._0_4_ = (int)local_1d8.deleter.m_device;
    data_01.deleter.m_device._4_4_ = (int)((ulong)local_1d8.deleter.m_device >> 0x20);
    data_01.deleter.m_allocator._0_4_ = (int)local_1d8.deleter.m_allocator;
    data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1d8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1b8,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar9 = Context::getBinaryCollection(stack0xffffffffffffffe8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,"frag",(allocator<char> *)((long)imageDim.m_data + 0xb));
    pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar9,(string *)local_2a0);
    ::vk::createShaderModule(&local_280,(DeviceInterface *)deviceInterface,device_00,pPVar10,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&local_280);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_260.deleter.m_deviceIface;
    data_02.object.m_internal = local_260.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_260.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device._0_4_ = (int)local_260.deleter.m_device;
    data_02.deleter.m_device._4_4_ = (int)((ulong)local_260.deleter.m_device >> 0x20);
    data_02.deleter.m_allocator._0_4_ = (int)local_260.deleter.m_allocator;
    data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_260.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_240,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_280);
    std::__cxx11::string::~string((string *)local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)imageDim.m_data + 0xb));
    imageDim.m_data[2]._0_1_ = ((features.variableMultisampleRate._3_1_ & 1) != 0) * '\x03' + 1;
    imageDim.m_data[2]._1_1_ = 4;
    imageDim.m_data[1]._3_1_ = 1;
    imageDim.m_data[1]._2_1_ = 1;
    imageDim.m_data[2]._2_1_ = (byte)imageDim.m_data[2];
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)
               ((long)&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                       m_allocator + 4),4,(uint)(byte)imageDim.m_data[2],1);
    image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._0_4_ = 9;
    makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&imageSubresourceRange.baseArrayLayer,
              (DeviceInterface *)deviceInterface,device_00,0,VK_IMAGE_TYPE_2D,
              VK_FORMAT_R8G8B8A8_UNORM,
              (IVec3 *)((long)&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                               m_allocator + 4),1,9,false);
    makeColorSubresourceRange
              ((VkImageSubresourceRange *)
               &imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                m_data.field_0xc,0,1);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &imageSubresourceRange.baseArrayLayer);
    imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_ =
         ::vk::MemoryRequirement::Any.m_flags;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_300,
              (DeviceInterface *)deviceInterface,device_00,allocator_00,(VkImage)pHVar11->m_internal
              ,::vk::MemoryRequirement::Any);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &imageSubresourceRange.baseArrayLayer);
    subresourceRange.levelCount = imageSubresourceRange.aspectMask;
    subresourceRange.aspectMask =
         imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
         _12_4_;
    subresourceRange.baseMipLevel = uStack_2e8;
    subresourceRange.baseArrayLayer = imageSubresourceRange.baseMipLevel;
    subresourceRange.layerCount = imageSubresourceRange.levelCount;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_330,
                  (DeviceInterface *)deviceInterface,device_00,(VkImage)pHVar11->m_internal,
                  VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
    uVar6 = (uint)(byte)imageDim.m_data[2];
    uVar28 = (uint)imageDim.m_data[2]._2_1_;
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    iVar7 = tcu::getPixelSize((TextureFormat)
                              colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                              deleter.m_allocator);
    makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
               &colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,(DeviceInterface *)deviceInterface,device_00,
               (long)(int)(uVar6 * uVar28 * 4 * iVar7),2);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_3a8,
               (Move *)&colorBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar31 = (undefined4)local_3a8.object.m_internal;
    uVar32 = (undefined4)(local_3a8.object.m_internal >> 0x20);
    uVar33 = SUB84(local_3a8.deleter.m_deviceIface,0);
    uVar34 = (undefined4)((ulong)local_3a8.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_deviceIface._0_4_ = uVar33;
    data_03.object.m_internal = local_3a8.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = uVar34;
    data_03.deleter.m_device._0_4_ = (int)local_3a8.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_3a8.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator._0_4_ = (int)local_3a8.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_3a8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_388,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_388);
    descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
    _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar29 = deviceInterface;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_3f8,
               (DeviceInterface *)deviceInterface,device_00,allocator_00,
               (VkBuffer)pHVar12->m_internal,::vk::MemoryRequirement::HostVisible);
    local_3e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_3f8,pMVar29);
    data.ptr._4_4_ = uVar32;
    data.ptr._0_4_ = uVar31;
    data._8_4_ = uVar33;
    data._12_4_ = uVar34;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_3f8);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_allocator);
    this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                        ((DescriptorSetLayoutBuilder *)
                         &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                          deleter.m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x10);
    ::vk::DescriptorSetLayoutBuilder::build
              ((Move<vk::Handle<(vk::HandleType)19>_> *)local_428,this_01,
               (DeviceInterface *)deviceInterface,device_00,0);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_allocator);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    this_02 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)
                         &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                          deleter.m_pool,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)local_490,this_02,
               (DeviceInterface *)deviceInterface,device_00,1,1);
    ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_490);
    descriptorPool_00.m_internal = pHVar13->m_internal;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_428);
    descriptorImageInfo._16_8_ = pHVar14->m_internal;
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)local_4c8,
                      (DeviceInterface *)deviceInterface,device_00,descriptorPool_00,
                      (VkDescriptorSetLayout)descriptorImageInfo._16_8_);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_4f8,0);
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_330);
    local_500 = pHVar15->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_4f0,local_4f8,(VkImageView)local_500,
               VK_IMAGE_LAYOUT_GENERAL);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_548);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_4c8);
    destSet.m_internal = pHVar16->m_internal;
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_548,destSet,
                         (Location *)
                         &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                          deleter.m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                         (VkDescriptorImageInfo *)local_4f0);
    ::vk::DescriptorSetUpdateBuilder::update(this_03,(DeviceInterface *)deviceInterface,device_00);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_548);
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_428);
    makePipelineLayout(&local_5b8,(DeviceInterface *)deviceInterface,device_00,
                       (VkDescriptorSetLayout)pHVar14->m_internal);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_598,(Move *)&local_5b8);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_598.deleter.m_deviceIface;
    data_04.object.m_internal = local_598.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_598.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_598.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_598.deleter.m_device >> 0x20);
    data_04.deleter.m_allocator._0_4_ = (int)local_598.deleter.m_allocator;
    data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_598.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_578,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5b8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                 m_allocator);
    makeRenderPassNoAtt((Move<vk::Handle<(vk::HandleType)17>_> *)
                        &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                         m_allocator,(DeviceInterface *)deviceInterface,device_00);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_618,
               (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                        m_allocator);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_618.deleter.m_deviceIface;
    data_05.object.m_internal = local_618.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_618.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device._0_4_ = (int)local_618.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_618.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator._0_4_ = (int)local_618.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_618.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5f8,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)17>_> *)
               &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                m_allocator);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move
              ((Move<vk::Handle<(vk::HandleType)23>_> *)
               &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
               (DeviceInterface *)deviceInterface,device_00,2,dVar5,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_698,
               (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_698.deleter.m_deviceIface;
    data_06.object.m_internal = local_698.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_698.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device._0_4_ = (int)local_698.deleter.m_device;
    data_06.deleter.m_device._4_4_ = (int)((ulong)local_698.deleter.m_device >> 0x20);
    data_06.deleter.m_allocator._0_4_ = (int)local_698.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_698.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_678,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_678);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar17->m_internal;
    makeCommandBuffer(&local_718,(DeviceInterface *)deviceInterface,device_00,
                      (VkCommandPool)
                      vertices.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_6f8,(Move *)&local_718);
    data_07.deleter.m_deviceIface._0_4_ = (int)local_6f8.deleter.m_deviceIface;
    data_07.object = local_6f8.object;
    data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6f8.deleter.m_deviceIface >> 0x20);
    data_07.deleter.m_device._0_4_ = (int)local_6f8.deleter.m_device;
    data_07.deleter.m_device._4_4_ = (int)((ulong)local_6f8.deleter.m_device >> 0x20);
    data_07.deleter.m_pool.m_internal._0_4_ = (int)local_6f8.deleter.m_pool.m_internal;
    data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_6f8.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_6d8,data_07);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_718);
    genPointVertices();
    local_740 = pipeline::(anonymous_namespace)::sizeInBytes<tcu::Vector<float,4>>
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&vertexBufferSize);
    makeBuffer(&local_780,(DeviceInterface *)deviceInterface,device_00,local_740,0x80);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_760,(Move *)&local_780);
    uVar31 = (undefined4)local_760.object.m_internal;
    uVar32 = (undefined4)(local_760.object.m_internal >> 0x20);
    uVar33 = SUB84(local_760.deleter.m_deviceIface,0);
    uVar34 = (undefined4)((ulong)local_760.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_deviceIface._0_4_ = uVar33;
    data_08.object.m_internal = local_760.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = uVar34;
    data_08.deleter.m_device._0_4_ = (int)local_760.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_760.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_760.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_760.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_780);
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &vertexBufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    local_7a8 = pHVar12->m_internal;
    local_7ac = ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar29 = deviceInterface;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a0,
               (DeviceInterface *)deviceInterface,device_00,allocator_00,(VkBuffer)local_7a8,
               ::vk::MemoryRequirement::HostVisible);
    local_790 = de::details::MovePtr::operator_cast_to_PtrData(&local_7a0,pMVar29);
    data_00.ptr._4_4_ = uVar32;
    data_00.ptr._0_4_ = uVar31;
    data_00._8_4_ = uVar33;
    data_00._12_4_ = uVar34;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a0);
    this = &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this);
    pvVar19 = ::vk::Allocation::getHostPtr(pAVar18);
    src = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &vertexBufferSize,0);
    ::deMemcpy(pvVar19,src,local_740);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this);
    local_7b8 = ::vk::Allocation::getMemory(pAVar18);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this);
    VVar20 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)deviceInterface,device_00,local_7b8,VVar20,local_740);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &vertexBufferSize);
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_578);
    local_7f0.m_internal = pHVar21->m_internal;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5f8);
    local_7f8.m_internal = pHVar22->m_internal;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
    local_800.m_internal = pHVar23->m_internal;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_240);
    local_808.m_internal = pHVar23->m_internal;
    tcu::Vector<int,_3>::Vector
              (&local_814,
               (Vector<int,_3> *)
               ((long)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                       m_allocator + 4));
    makeGraphicsPipeline
              (&local_7e8,(DeviceInterface *)deviceInterface,device_00,local_7f0,local_7f8,local_800
               ,local_808,&local_814,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,false,
               (bool)(features.variableMultisampleRate._3_1_ & 1));
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&local_7c8,&local_7e8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                    m_allocator,&local_7c8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_7c8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_7e8);
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5f8);
    setImageLayoutBarrier._64_8_ = pHVar22->m_internal;
    pVVar1 = (Vector<int,_3> *)
             ((long)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_allocator + 4);
    dVar5 = tcu::Vector<int,_3>::x(pVVar1);
    dVar8 = tcu::Vector<int,_3>::y(pVVar1);
    makeFramebuffer(&local_858,(DeviceInterface *)deviceInterface,device_00,
                    (VkRenderPass)setImageLayoutBarrier._64_8_,0,(VkImageView *)0x0,dVar5,dVar8,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_838,(Move *)&local_858);
    data_09.deleter.m_deviceIface._0_4_ = (int)local_838.deleter.m_deviceIface;
    data_09.object.m_internal = local_838.object.m_internal;
    data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_838.deleter.m_deviceIface >> 0x20);
    data_09.deleter.m_device._0_4_ = (int)local_838.deleter.m_device;
    data_09.deleter.m_device._4_4_ = (int)((ulong)local_838.deleter.m_device >> 0x20);
    data_09.deleter.m_allocator._0_4_ = (int)local_838.deleter.m_allocator;
    data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_838.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)23>_> *)
               &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
               data_09);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_858);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    beginCommandBuffer((DeviceInterface *)deviceInterface,*ppVVar24);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &imageSubresourceRange.baseArrayLayer);
    subresourceRange_00.levelCount = imageSubresourceRange.aspectMask;
    subresourceRange_00.aspectMask =
         imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
         _12_4_;
    subresourceRange_00.baseMipLevel = uStack_2e8;
    subresourceRange_00.baseArrayLayer = imageSubresourceRange.baseMipLevel;
    subresourceRange_00.layerCount = imageSubresourceRange.levelCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_8a8,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_GENERAL,(VkImage)pHVar11->m_internal,subresourceRange_00);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x6d])
              (deviceInterface,*ppVVar24,1,0x80,0,0,0,0,0,1,local_8a8);
    renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
    pVVar1 = (Vector<int,_3> *)
             ((long)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_allocator + 4);
    dVar5 = tcu::Vector<int,_3>::x(pVVar1);
    dVar8 = tcu::Vector<int,_3>::y(pVVar1);
    VVar25 = ::vk::makeExtent2D(dVar5,dVar8);
    vertexBufferOffset._0_4_ = 0x2b;
    renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassBeginInfo._4_4_ = 0;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5f8);
    renderPassBeginInfo.pNext = (void *)pHVar22->m_internal;
    pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)
                         &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_allocator);
    renderPassBeginInfo.renderPass.m_internal = pHVar26->m_internal;
    renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
    renderPassBeginInfo.renderArea.extent.width = 0;
    renderPassBeginInfo.clearValueCount = 0;
    renderPassBeginInfo._52_4_ = 0;
    local_920 = 0;
    renderPassBeginInfo.renderArea.offset = (VkOffset2D)VVar25;
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x74])(deviceInterface,*ppVVar24,&vertexBufferOffset,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    pVVar2 = *ppVVar24;
    this_04 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                               deleter.m_allocator,0);
    this_05 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (this_04)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(this_05);
    (*(*(_func_int ***)deviceInterface)[0x4c])(deviceInterface,pVVar2,0,pHVar27->m_internal);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    pVVar2 = *ppVVar24;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &vertexBufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    (*(*(_func_int ***)deviceInterface)[0x58])(deviceInterface,pVVar2,0,1,pHVar12,&local_920);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    pVVar2 = *ppVVar24;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_578);
    imageBarriers[0]._64_8_ = pHVar21->m_internal;
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_4c8);
    (*(*(_func_int ***)deviceInterface)[0x56])
              (deviceInterface,pVVar2,0,imageBarriers[0]._64_8_,0,1,(int)pHVar16,0,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x59])(deviceInterface,*ppVVar24,4,1,0);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
              ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x76])();
    region.imageExtent.height = 0x2d;
    imageBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageBarriers[0]._4_4_ = 0;
    imageBarriers[0].pNext._0_4_ = 0x40;
    imageBarriers[0].pNext._4_4_ = 0x800;
    imageBarriers[0].srcAccessMask = 1;
    imageBarriers[0].dstAccessMask = 6;
    imageBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    imageBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &imageSubresourceRange.baseArrayLayer);
    imageBarriers[0]._32_8_ = pHVar11->m_internal;
    makeColorSubresourceRange((VkImageSubresourceRange *)&imageBarriers[0].image,0,1);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x6d])
              (deviceInterface,*ppVVar24,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
    local_9b0 = 0;
    region.bufferOffset._0_4_ = 0;
    region.bufferOffset._4_4_ = 0;
    region._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,1);
    VVar30 = ::vk::makeOffset3D(0,0,0);
    local_9c0.z = VVar30.z;
    region.imageOffset.x = local_9c0.z;
    local_9c0._0_8_ = VVar30._0_8_;
    region.imageSubresource.baseArrayLayer = local_9c0.x;
    region.imageSubresource.layerCount = local_9c0.y;
    local_9c0 = VVar30;
    tcu::Vector<int,_3>::Vector(&local_9cc,4,(uint)(byte)imageDim.m_data[2],1);
    region._36_12_ = ::vk::makeExtent3D(&local_9cc);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    pVVar2 = *ppVVar24;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &imageSubresourceRange.baseArrayLayer);
    dVar3 = pHVar11->m_internal;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_388);
    bufferBarriers[0].size = pHVar12->m_internal;
    (*(*(_func_int ***)deviceInterface)[99])
              (deviceInterface,pVVar2,dVar3,6,bufferBarriers[0].size,1,(int)&local_9b0);
    local_a28[0] = 0x2c;
    bufferBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bufferBarriers[0]._4_4_ = 0;
    bufferBarriers[0].pNext._0_4_ = 0x1000;
    bufferBarriers[0].pNext._4_4_ = 0x2000;
    bufferBarriers[0].srcAccessMask = 0xffffffff;
    bufferBarriers[0].dstAccessMask = 0xffffffff;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_388);
    bufferBarriers[0]._24_8_ = pHVar12->m_internal;
    bufferBarriers[0].buffer.m_internal = 0;
    bufferBarriers[0].offset = 0xffffffffffffffff;
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    (*(*(_func_int ***)deviceInterface)[0x6d])
              (deviceInterface,*ppVVar24,0x1000,0x4000,0,0,0,1,(int)local_a28,0,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    result = (*(*(_func_int ***)deviceInterface)[0x4a])(deviceInterface,*ppVVar24);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                      ,0x43e);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6d8);
    submitCommandsAndWait((DeviceInterface *)deviceInterface,device_00,queue_00,*ppVVar24);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_3d8);
    memory = ::vk::Allocation::getMemory(pAVar18);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_3d8);
    VVar20 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)deviceInterface,device_00,memory,VVar20,0xffffffffffffffff);
    textureLevel.m_data.m_cap = (size_t)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data,
               (TextureFormat *)&textureLevel.m_data.m_cap,4,(uint)(byte)imageDim.m_data[2],1);
    getExpectedDataNoAtt
              ((PixelBufferAccess *)&resultImage.m_data,
               (TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
    uVar6 = (uint)(byte)imageDim.m_data[2];
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_3d8);
    pvVar19 = ::vk::Allocation::getHostPtr(pAVar18);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_ab0,(TextureFormat *)&textureLevel.m_data.m_cap,4,
               uVar6,1,pvVar19);
    this_06 = Context::getTestContext(stack0xffffffffffffffe8);
    log = tcu::TestContext::getLog(this_06);
    tcu::Vector<unsigned_int,_4>::Vector(&local_ac0,1);
    bVar4 = tcu::intThresholdCompare
                      (log,"Image Comparison","",(ConstPixelBufferAccess *)&resultImage.m_data,
                       (ConstPixelBufferAccess *)local_ab0,&local_ac0,COMPARE_LOG_RESULT);
    bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"Fail",&local_ae1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::allocator<char>::~allocator(&local_ae1);
    }
    local_ae8 = (uint)bVar4;
    tcu::TextureLevel::~TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
    if (local_ae8 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"Pass",&local_b09);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_b08);
      std::__cxx11::string::~string((string *)&local_b08);
      std::allocator<char>::~allocator(&local_b09);
      local_ae8 = 1;
    }
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_6d8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_678);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)23>_> *)
               &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5f8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               *)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                  m_allocator);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_578);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)22>_> *)local_4c8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)21>_> *)local_490);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)19>_> *)local_428);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_388);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_330);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_300);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)&imageSubresourceRange.baseArrayLayer);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_240);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    return __return_storage_ptr__;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"fragmentStoresAndAtomics feature not supported",&local_119);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_118);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestStatus testNoAtt (Context& context, const bool multisample)
{
	const VkPhysicalDeviceFeatures		features				= context.getDeviceFeatures();
	if (!features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("fragmentStoresAndAtomics feature not supported");

	const DeviceInterface&				vk						= context.getDeviceInterface();
	const VkDevice						device					= context.getDevice();
	const VkQueue						queue					= context.getUniversalQueue();
	const deUint32						queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	Allocator&							allocator				= context.getDefaultAllocator();
	const IVec3							renderSize				(32, 32, 1);

	Move<VkBuffer>						vertexBuffer;
	MovePtr<Allocation>					vertexBufferAlloc;

	const Unique<VkShaderModule>		vertexModule			(createShaderModule (vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>		fragmentModule			(createShaderModule (vk, device, context.getBinaryCollection().get("frag"), 0u));

	// Create image where we will record the writes. For single-sampled cases this is a 4x1 image
	// and for multi-sampled cases this is a 4x<num_samples> image.
	const deUint8						numSamples				= multisample ? 4 : 1;
	const deUint8						imageWidth				= 4;
	const deUint8						imageHeight				= numSamples;
	const deUint8						imageDepth				= 1;
	const deUint8						imageLayers				= 1;
	const IVec3							imageDim				= IVec3(imageWidth, imageHeight, imageDepth);
	const VkImageUsageFlags				imageUsage				= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT;
	const Move<VkImage>					image					= makeImage(vk, device, VkImageViewCreateFlags(0), VK_IMAGE_TYPE_2D, COLOR_FORMAT, imageDim, imageLayers, imageUsage, false);
	const VkImageSubresourceRange		imageSubresourceRange	= makeColorSubresourceRange(0u, imageLayers);
	const MovePtr<Allocation>			imageAlloc				= bindImage(vk, device, allocator, *image, MemoryRequirement::Any);
	const Move<VkImageView>				imageView				= makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, COLOR_FORMAT, imageSubresourceRange);

	// Create a buffer where we will copy the image for verification
	const VkDeviceSize					colorBufferSize		= imageWidth * imageHeight * imageDepth * numSamples * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>				colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>			colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	// Create pipeline descriptor set for the image
	const Move<VkDescriptorSetLayout>	descriptorSetLayout		= DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(vk, device);

	const Move<VkDescriptorPool>		descriptorPool			= DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1);

	const Move<VkDescriptorSet>			descriptorSet			= makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout);
	const VkDescriptorImageInfo			descriptorImageInfo		= makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(vk, device);

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout (vk, device, *descriptorSetLayout));
	vector<SharedPtrVkPipeline>			pipeline;
	const Unique<VkRenderPass>			renderPass				(makeRenderPassNoAtt (vk, device));
	Move<VkFramebuffer>					framebuffer;

	const Unique<VkCommandPool>			cmdPool					(createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>		cmdBuffer				(makeCommandBuffer (vk, device, *cmdPool));

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genPointVertices();
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Create render pass and pipeline
	pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
		renderSize, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0, false, multisample)));
	framebuffer = makeFramebuffer(vk, device, *renderPass, 0, DE_NULL, renderSize.x(), renderSize.y());

	// Record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// shader image layout transition undefined -> general
		{
			const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
				0u, VK_ACCESS_SHADER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
				*image, imageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0,
				0, DE_NULL, 0, DE_NULL, 1, &setImageLayoutBarrier);
		}

		// Render pass
		{
			const VkRect2D renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize vertexBufferOffset = 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[0]);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout.get(), 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, 0u, 0u);

			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// copy image to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
					DE_NULL,									// const void*				pNext;
					VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_GENERAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
					*image,										// VkImage					image;
					makeColorSubresourceRange(0, 1)				// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																// VkDeviceSize                bufferOffset;
				0u,																	// uint32_t                    bufferRowLength;
				0u,																	// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),												// VkOffset3D                  imageOffset;
				makeExtent3D(IVec3(imageWidth, imageHeight, imageDepth)),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		tcu::TextureLevel					textureLevel	(format, imageWidth, imageHeight, imageDepth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedDataNoAtt(textureLevel);
		const tcu::ConstPixelBufferAccess	resultImage		(format, imageWidth, imageHeight, imageDepth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}